

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_clock_linux.c
# Opt level: O0

int os_clock_linux_gettime64_ns(uint64_t *t64)

{
  undefined1 local_30 [8];
  timespec ts;
  int error;
  uint64_t *t64_local;
  
  if (_clock_source == 0) {
    t64_local._4_4_ = -1;
  }
  else {
    t64_local._4_4_ = clock_gettime(_clock_source,(timespec *)local_30);
    if (t64_local._4_4_ == 0) {
      *t64 = (long)local_30 * 1000000000 + ts.tv_sec;
      t64_local._4_4_ = 0;
    }
  }
  return t64_local._4_4_;
}

Assistant:

int
os_clock_linux_gettime64_ns(uint64_t *t64) {
  int error;

#if defined(CLOCK_MONOTONIC_RAW) || defined(CLOCK_MONOTONIC)
  if (_clock_source) {
    struct timespec ts;

    if ((error = clock_gettime(_clock_source, &ts)) != 0) {
      return error;
    }

    *t64 = 1000000000ull * ts.tv_sec + ts.tv_nsec;
    return 0;
  }
#endif
  return -1;
}